

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OutputToFont.cpp
# Opt level: O0

size_t __thiscall
GrcManager::OutputCmap31Table
          (GrcManager *this,void *pCmapSubTblSrc,GrcBinaryStream *pbstrm,bool fFrom310,
          bool *pfNeed310)

{
  int iVar1;
  offset_t oVar2;
  reference pvVar3;
  GrcBinaryStream *this_00;
  byte in_CL;
  byte *in_R8;
  int nLog;
  int nPowerOf2;
  size_t cb;
  offset_t lPosEnd;
  int ich;
  int nRangeOffset;
  int nEnd;
  int nStart;
  int cchSoFar;
  int iGroup;
  int cbNeeded;
  int ch;
  int key;
  bool fTruncated;
  int cGroups;
  vector<int,_std::allocator<int>_> vichGroupStart;
  utf16 rgchChars [65535];
  offset_t lPosSearch;
  offset_t lPosLen;
  int cch;
  offset_t lPosStart;
  undefined4 in_stack_fffffffffffdfed8;
  undefined2 in_stack_fffffffffffdfedc;
  unsigned_short in_stack_fffffffffffdfede;
  GrcBinaryStream *in_stack_fffffffffffdfee0;
  value_type_conflict1 *in_stack_fffffffffffdfee8;
  allocator *paVar4;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffdfef0;
  int *in_stack_fffffffffffdfef8;
  vector<int,_std::allocator<int>_> *this_01;
  undefined8 in_stack_fffffffffffdff00;
  int *in_stack_fffffffffffdff08;
  uint in_stack_fffffffffffdff14;
  uint in_stack_fffffffffffdff18;
  uint in_stack_fffffffffffdff1c;
  uint uStack_200dc;
  uint in_stack_fffffffffffdff28;
  undefined4 in_stack_fffffffffffdff2c;
  GdlObject *in_stack_fffffffffffdff30;
  int in_stack_fffffffffffdff3c;
  GrcErrorList *in_stack_fffffffffffdff40;
  int iStack_200b0;
  int iStack_200ac;
  size_t sStack_200a8;
  GrcBinaryStream *pGStack_200a0;
  int iStack_20098;
  int iStack_20094;
  uint uStack_20090;
  uint uStack_2008c;
  int iStack_20088;
  int iStack_20084;
  int iStack_20080;
  uint uStack_20070;
  undefined4 uStack_2006c;
  byte bStack_20065;
  int iStack_20064;
  vector<int,_std::allocator<int>_> vStack_20060;
  ushort auStack_20048 [65546];
  int local_34;
  
  oVar2 = GrcBinaryStream::Position(in_stack_fffffffffffdfee0);
  local_34 = 0;
  GrcBinaryStream::WriteShort<int>
            (in_stack_fffffffffffdfee0,CONCAT22(in_stack_fffffffffffdfede,in_stack_fffffffffffdfedc)
            );
  GrcBinaryStream::Position(in_stack_fffffffffffdfee0);
  GrcBinaryStream::WriteShort<int>
            (in_stack_fffffffffffdfee0,CONCAT22(in_stack_fffffffffffdfede,in_stack_fffffffffffdfedc)
            );
  GrcBinaryStream::WriteShort<int>
            (in_stack_fffffffffffdfee0,CONCAT22(in_stack_fffffffffffdfede,in_stack_fffffffffffdfedc)
            );
  GrcBinaryStream::Position(in_stack_fffffffffffdfee0);
  GrcBinaryStream::WriteShort<int>
            (in_stack_fffffffffffdfee0,CONCAT22(in_stack_fffffffffffdfede,in_stack_fffffffffffdfedc)
            );
  GrcBinaryStream::WriteShort<int>
            (in_stack_fffffffffffdfee0,CONCAT22(in_stack_fffffffffffdfede,in_stack_fffffffffffdfedc)
            );
  GrcBinaryStream::WriteShort<int>
            (in_stack_fffffffffffdfee0,CONCAT22(in_stack_fffffffffffdfede,in_stack_fffffffffffdfedc)
            );
  GrcBinaryStream::WriteShort<int>
            (in_stack_fffffffffffdfee0,CONCAT22(in_stack_fffffffffffdfede,in_stack_fffffffffffdfedc)
            );
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x24dad5);
  iStack_20064 = 0;
  bStack_20065 = 0;
  uStack_2006c = 0;
  if ((in_CL & 1) == 0) {
    uStack_200dc = TtfUtil::Cmap31NextCodepoint
                             ((void *)CONCAT44(in_stack_fffffffffffdff1c,in_stack_fffffffffffdff18),
                              in_stack_fffffffffffdff14,in_stack_fffffffffffdff08);
  }
  else {
    uStack_200dc = TtfUtil::Cmap310NextCodepoint
                             (in_stack_fffffffffffdff08,
                              (uint)((ulong)in_stack_fffffffffffdff00 >> 0x20),
                              in_stack_fffffffffffdfef8);
    in_stack_fffffffffffdff28 = uStack_200dc;
  }
  uStack_20070 = uStack_200dc;
  iVar1 = local_34;
  while (local_34 = iVar1, (int)uStack_20070 < 0xffff) {
    auStack_20048[local_34] = (ushort)uStack_20070;
    if ((local_34 == 0) || (uStack_20070 != auStack_20048[local_34 + -1] + 1)) {
      std::vector<int,_std::allocator<int>_>::push_back
                (in_stack_fffffffffffdfef0,in_stack_fffffffffffdfee8);
      iStack_20064 = iStack_20064 + 1;
    }
    if ((in_CL & 1) == 0) {
      in_stack_fffffffffffdff14 =
           TtfUtil::Cmap31NextCodepoint
                     ((void *)CONCAT44(in_stack_fffffffffffdff1c,in_stack_fffffffffffdff18),
                      in_stack_fffffffffffdff14,in_stack_fffffffffffdff08);
      in_stack_fffffffffffdff18 = in_stack_fffffffffffdff14;
    }
    else {
      in_stack_fffffffffffdff1c =
           TtfUtil::Cmap310NextCodepoint
                     (in_stack_fffffffffffdff08,(uint)((ulong)in_stack_fffffffffffdff00 >> 0x20),
                      in_stack_fffffffffffdfef8);
      in_stack_fffffffffffdff18 = in_stack_fffffffffffdff1c;
    }
    iStack_20080 = iStack_20064 * 8 + (local_34 + 1) * 2 + 0x18;
    uStack_20070 = in_stack_fffffffffffdff18;
    iVar1 = local_34 + 1;
    if (0xfffe < iStack_20080) {
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&vStack_20060,(long)(iStack_20064 + -1));
      if (*pvVar3 == local_34) {
        std::vector<int,_std::allocator<int>_>::pop_back
                  ((vector<int,_std::allocator<int>_> *)0x24dcd5);
        iStack_20064 = iStack_20064 + -1;
      }
      uStack_20070 = 0xffff;
      bStack_20065 = 1;
      iVar1 = local_34;
    }
  }
  auStack_20048[local_34] = 0xffff;
  std::vector<int,_std::allocator<int>_>::push_back
            (in_stack_fffffffffffdfef0,in_stack_fffffffffffdfee8);
  iStack_20064 = iStack_20064 + 1;
  for (iStack_20084 = 0; iStack_20084 < iStack_20064 + -1; iStack_20084 = iStack_20084 + 1) {
    std::vector<int,_std::allocator<int>_>::operator[](&vStack_20060,(long)(iStack_20084 + 1));
    GrcBinaryStream::WriteShort<unsigned_short>(in_stack_fffffffffffdfee0,in_stack_fffffffffffdfede)
    ;
  }
  GrcBinaryStream::WriteShort<int>
            (in_stack_fffffffffffdfee0,CONCAT22(in_stack_fffffffffffdfede,in_stack_fffffffffffdfedc)
            );
  GrcBinaryStream::WriteShort<int>
            (in_stack_fffffffffffdfee0,CONCAT22(in_stack_fffffffffffdfede,in_stack_fffffffffffdfedc)
            );
  for (iStack_20084 = 0; iStack_20084 < iStack_20064; iStack_20084 = iStack_20084 + 1) {
    std::vector<int,_std::allocator<int>_>::operator[](&vStack_20060,(long)iStack_20084);
    GrcBinaryStream::WriteShort<unsigned_short>(in_stack_fffffffffffdfee0,in_stack_fffffffffffdfede)
    ;
  }
  for (iStack_20084 = 0; iStack_20084 < iStack_20064; iStack_20084 = iStack_20084 + 1) {
    GrcBinaryStream::WriteShort<int>
              (in_stack_fffffffffffdfee0,
               CONCAT22(in_stack_fffffffffffdfede,in_stack_fffffffffffdfedc));
  }
  iStack_20088 = 0;
  for (iStack_20084 = 0; iStack_20084 < iStack_20064 + -1; iStack_20084 = iStack_20084 + 1) {
    this_01 = &vStack_20060;
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](this_01,(long)iStack_20084);
    uStack_2008c = (uint)auStack_20048[*pvVar3];
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](this_01,(long)(iStack_20084 + 1));
    uStack_20090 = (uint)auStack_20048[*pvVar3 + -1];
    iStack_20094 = ((iStack_20064 - iStack_20084) + iStack_20088) * 2;
    GrcBinaryStream::WriteShort<int>
              (in_stack_fffffffffffdfee0,
               CONCAT22(in_stack_fffffffffffdfede,in_stack_fffffffffffdfedc));
    iStack_20088 = (uStack_20090 - uStack_2008c) + 1 + iStack_20088;
  }
  GrcBinaryStream::WriteShort<int>
            (in_stack_fffffffffffdfee0,CONCAT22(in_stack_fffffffffffdfede,in_stack_fffffffffffdfedc)
            );
  iStack_20088 = iStack_20088 + 1;
  for (iStack_20098 = 0; iStack_20098 < local_34 + 1; iStack_20098 = iStack_20098 + 1) {
    if (auStack_20048[iStack_20098] == 0x20) {
      GrcBinaryStream::WriteShort<int>
                (in_stack_fffffffffffdfee0,
                 CONCAT22(in_stack_fffffffffffdfede,in_stack_fffffffffffdfedc));
    }
    else if (auStack_20048[iStack_20098] == 0xffff) {
      GrcBinaryStream::WriteShort<int>
                (in_stack_fffffffffffdfee0,
                 CONCAT22(in_stack_fffffffffffdfede,in_stack_fffffffffffdfedc));
    }
    else {
      GrcBinaryStream::WriteShort<int>
                (in_stack_fffffffffffdfee0,
                 CONCAT22(in_stack_fffffffffffdfede,in_stack_fffffffffffdfedc));
    }
  }
  this_00 = (GrcBinaryStream *)GrcBinaryStream::Position(in_stack_fffffffffffdfee0);
  sStack_200a8 = (long)this_00 - oVar2;
  pGStack_200a0 = this_00;
  GrcBinaryStream::SetPosition(this_00,(offset_t)in_stack_fffffffffffdfee8);
  GrcBinaryStream::WriteShort<unsigned_long>
            (in_stack_fffffffffffdfee0,
             CONCAT26(in_stack_fffffffffffdfede,
                      CONCAT24(in_stack_fffffffffffdfedc,in_stack_fffffffffffdfed8)));
  BinarySearchConstants(iStack_20064,&iStack_200ac,&iStack_200b0);
  GrcBinaryStream::SetPosition(this_00,(offset_t)in_stack_fffffffffffdfee8);
  GrcBinaryStream::WriteShort<int>
            (in_stack_fffffffffffdfee0,CONCAT22(in_stack_fffffffffffdfede,in_stack_fffffffffffdfedc)
            );
  GrcBinaryStream::WriteShort<int>
            (in_stack_fffffffffffdfee0,CONCAT22(in_stack_fffffffffffdfede,in_stack_fffffffffffdfedc)
            );
  GrcBinaryStream::WriteShort<int>
            (in_stack_fffffffffffdfee0,CONCAT22(in_stack_fffffffffffdfede,in_stack_fffffffffffdfedc)
            );
  GrcBinaryStream::WriteShort<int>
            (in_stack_fffffffffffdfee0,CONCAT22(in_stack_fffffffffffdfede,in_stack_fffffffffffdfedc)
            );
  GrcBinaryStream::SetPosition(this_00,(offset_t)in_stack_fffffffffffdfee8);
  if ((bStack_20065 & 1) != 0) {
    paVar4 = (allocator *)&stack0xfffffffffffdff2f;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&stack0xfffffffffffdff30,
               "cmap format 4 subtable truncated--does not match format 12 subtable",paVar4);
    GrcErrorList::AddWarning
              (in_stack_fffffffffffdff40,in_stack_fffffffffffdff3c,in_stack_fffffffffffdff30,
               (string *)CONCAT44(in_stack_fffffffffffdff2c,in_stack_fffffffffffdff28));
    std::__cxx11::string::~string((string *)&stack0xfffffffffffdff30);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffdff2f);
  }
  *in_R8 = bStack_20065 & 1;
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)this_00);
  return sStack_200a8;
}

Assistant:

size_t GrcManager::OutputCmap31Table(void * pCmapSubTblSrc,
	GrcBinaryStream * pbstrm, bool fFrom310, bool * pfNeed310)
{
	auto lPosStart = pbstrm->Position();

	int cch = 0;	// number of codepoints in the map

	//	format
	pbstrm->WriteShort(4);

	//	length: fill in later
	auto lPosLen = pbstrm->Position();
	pbstrm->WriteShort(0);

	//	language (irrelevant except on Macintosh)
	pbstrm->WriteShort(0);

	//	search variables: fill in later
	auto lPosSearch = pbstrm->Position();
	pbstrm->WriteShort(0);
	pbstrm->WriteShort(0);
	pbstrm->WriteShort(0);
	pbstrm->WriteShort(0);

	//	Generate the list of supported characters.

	utf16 rgchChars[65535];
	std::vector<int> vichGroupStart;
	//std::vector<int> vcchGroupSize;
	int cGroups = 0;
	bool fTruncated = false;
	int key = 0; // for optimizing next-codepoint lookup
	int ch = (fFrom310) ?
		TtfUtil::Cmap310NextCodepoint(pCmapSubTblSrc, 0, &key) :
		TtfUtil::Cmap31NextCodepoint(pCmapSubTblSrc, 0, &key);
	while (ch < 0xFFFF)
	{
		rgchChars[cch] = ch;
		if (cch == 0 || ch != rgchChars[cch - 1] + 1)
		{
			vichGroupStart.push_back(cch);
			cGroups++;
		}

		cch++;
		ch = (fFrom310) ?
			TtfUtil::Cmap310NextCodepoint(pCmapSubTblSrc, ch, &key) :
			TtfUtil::Cmap31NextCodepoint(pCmapSubTblSrc, ch, &key);

		// If we're over the limit of what the subtable can handle, truncate.
		int cbNeeded = 14	// header
			+ (cGroups * 8)	// group information
			+ (cch * 2)		// glyphIdArray
			+ 10;			// final FFFF
		if (cbNeeded >= 0xFFFF) // 65535 is limit on subtable length
		{
			if (vichGroupStart[cGroups - 1] == cch - 1)
			{
				vichGroupStart.pop_back();
				cGroups--;
			}
			cch--;
			ch = 0xFFFF;
			fTruncated = true;
		}
	}
	rgchChars[cch] = 0xFFFF;  // this must always be last
	vichGroupStart.push_back(cch);
	cGroups++;
	cch++;

	//	Output the ranges of characters.

	//	End codes
	int iGroup;
	for (iGroup = 0; iGroup < cGroups - 1; iGroup++)
		pbstrm->WriteShort(rgchChars[vichGroupStart[iGroup+1] - 1]);
	pbstrm->WriteShort(0xFFFF);

	//	reserved pad
	pbstrm->WriteShort(0);

	//	Start codes
	for (iGroup = 0; iGroup < cGroups; iGroup++)
		pbstrm->WriteShort(rgchChars[vichGroupStart[iGroup]]);

	//	id delta: not used; pad with zeros
	for (iGroup = 0; iGroup < cGroups; iGroup++)
		pbstrm->WriteShort(0);

	//	id range array: each element holds the offset (in bytes) from the element
	//	itself down to the corresponding glyphIdArray element (this works because
	//	glyphIdArray immediately follows idRangeArray).
	int cchSoFar = 0;
	for (iGroup = 0; iGroup < cGroups - 1; iGroup++)
	{
		int nStart = rgchChars[vichGroupStart[iGroup]];
		int nEnd = rgchChars[vichGroupStart[iGroup+1] - 1];

		int nRangeOffset = (cGroups - iGroup + cchSoFar) * 2; // *2 for bytes, not wchars
		pbstrm->WriteShort(nRangeOffset);

		cchSoFar += (nEnd - nStart + 1);
	}
	pbstrm->WriteShort((1 + cchSoFar) * 2);
	cchSoFar++;

	//	glyphIdArray: all characters point to our special square box,
	//	except for the space character.
	for (int ich = 0; ich < cch; ich++)
	{
		if (rgchChars[ich] == kchwSpace)
			pbstrm->WriteShort(2);
		else if (rgchChars[ich] == 0xFFFF) // invalid
			pbstrm->WriteShort(0);
		else
			pbstrm->WriteShort(3);
	}

	auto lPosEnd = pbstrm->Position();

	//	Fill in the length.
	size_t cb = size_t(lPosEnd - lPosStart);
	pbstrm->SetPosition(lPosLen);
	pbstrm->WriteShort(cb);

	//	Fill in the search variables; note that these are byte-based and so are multiplied by 2,
	//	unlike what is done in the Graphite tables.
	int nPowerOf2, nLog;
	BinarySearchConstants(cGroups, &nPowerOf2, &nLog);
	pbstrm->SetPosition(lPosSearch);
	pbstrm->WriteShort(cGroups << 1);	// * 2
	pbstrm->WriteShort(nPowerOf2 << 1); // * 2
	pbstrm->WriteShort(nLog);
	pbstrm->WriteShort((cGroups - nPowerOf2) << 1);  // * 2

	pbstrm->SetPosition(lPosEnd);

	if (fTruncated)
	{
		g_errorList.AddWarning(5502, NULL,
			"cmap format 4 subtable truncated--does not match format 12 subtable");
	}

	*pfNeed310 = fTruncated;

	return cb;
}